

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_dpll_triad_simd.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_1945d::SolverDpllTriadSimd<1>::CountSolutionsConsistentWithPartialAssignment
          (SolverDpllTriadSimd<1> *this,State *state)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint band_idx;
  undefined1 auVar3 [16];
  undefined8 uVar4;
  bool bVar5;
  bool bVar6;
  ulong uVar7;
  State *pSVar8;
  long lVar9;
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  State state_copy;
  State local_240;
  
  auVar11 = vpopcntq_avx512_vpopcntdq
                      (*(undefined1 (*) [16])(this->solution_).bands[0][0].configurations.vec);
  auVar12 = vpopcntq_avx512_vpopcntdq
                      (*(undefined1 (*) [16])(this->solution_).bands[0][1].configurations.vec);
  auVar15._8_8_ = 0xf000e00040000;
  auVar15._0_8_ = 0xf000e00040000;
  auVar14 = vpunpcklqdq_avx(auVar11,auVar12);
  auVar11 = vpunpckhqdq_avx(auVar11,auVar12);
  auVar13 = vpopcntq_avx512_vpopcntdq
                      (*(undefined1 (*) [16])(this->solution_).bands[0][2].configurations.vec);
  auVar11 = vpaddq_avx(auVar14,auVar11);
  auVar14 = vpopcntq_avx512_vpopcntdq
                      (*(undefined1 (*) [16])(this->solution_).bands[1][0].configurations.vec);
  auVar12 = vpunpcklqdq_avx(auVar13,auVar14);
  auVar14 = vpunpckhqdq_avx(auVar13,auVar14);
  auVar13 = vpopcntq_avx512_vpopcntdq
                      (*(undefined1 (*) [16])(this->solution_).bands[1][1].configurations.vec);
  auVar14 = vpaddq_avx(auVar12,auVar14);
  auVar12 = vpopcntq_avx512_vpopcntdq
                      (*(undefined1 (*) [16])(this->solution_).bands[1][2].configurations.vec);
  auVar17 = vpunpcklqdq_avx(auVar13,auVar12);
  auVar3 = vpunpckhqdq_avx(auVar13,auVar12);
  auVar12 = vpcmpeqd_avx(auVar12,auVar12);
  auVar15 = vpermi2w_avx512vl(auVar15,auVar11,auVar12);
  auVar12 = vpmovsxbw_avx(ZEXT816(0x70600000c080100));
  auVar13 = vpmovsxbw_avx(ZEXT816(0x7060c0803020100));
  auVar11 = vpaddq_avx(auVar17,auVar3);
  auVar14 = vpermi2w_avx512vl(auVar12,auVar15,auVar14);
  auVar11 = vpermi2w_avx512vl(auVar13,auVar14,auVar11);
  auVar14._8_2_ = 0xfff6;
  auVar14._0_8_ = 0xfff6fff6fff6fff6;
  auVar14._10_2_ = 0xfff6;
  auVar14._12_2_ = 0xfff6;
  auVar14._14_2_ = 0xfff6;
  auVar11 = vpaddw_avx(auVar11,auVar14);
  auVar11 = vphminposuw_avx(auVar11);
  if ((auVar11 & (undefined1  [16])0xff00) == (undefined1  [16])0x0) {
    uVar7 = (ulong)(auVar11._0_4_ >> 0x10);
    band_idx = *(uint *)((anonymous_namespace)::tables + uVar7 * 4 + 0x18dc);
    auVar14 = *(undefined1 (*) [16])
               (this->solution_).bands[*(int *)((anonymous_namespace)::tables + uVar7 * 4 + 0x18b8)]
               [(int)band_idx].configurations.vec;
    auVar12 = vpshufb_avx(auVar14,_DAT_0010b820);
    auVar13 = vpblendd_avx2(auVar12,(undefined1  [16])0x0,8);
    auVar3 = vpshufb_avx(auVar12,_DAT_0010b830);
    auVar12 = vpand_avx(auVar14,auVar13);
    auVar13 = vpor_avx(auVar14,auVar13);
    auVar17 = vpshufb_avx(auVar3,_DAT_0010b820);
    auVar14 = vpand_avx(auVar12,auVar3);
    auVar16 = vpternlogq_avx512vl(auVar12,auVar13,auVar3,0xf8);
    auVar12 = vpor_avx(auVar13,auVar3);
    auVar15 = vpblendd_avx2(auVar17,(undefined1  [16])0x0,8);
    auVar13 = vpshufb_avx(auVar17,_DAT_0010b830);
    auVar17 = vpternlogq_avx512vl(auVar14,auVar16,auVar15,0xf8);
    auVar16 = vpternlogq_avx512vl(auVar16,auVar12,auVar15,0xf8);
    auVar12 = vpor_avx(auVar12,auVar15);
    auVar3 = vpshufb_avx(auVar13,_DAT_0010b830);
    auVar18 = vpternlogq_avx512vl(auVar17,auVar16,auVar13,0xf8);
    auVar16 = vpternlogq_avx512vl(auVar16,auVar12,auVar13,0xf8);
    auVar12 = vpor_avx(auVar12,auVar13);
    auVar19 = vpternlogq_avx512vl(auVar18,auVar16,auVar3,0xf8);
    auVar12 = vpternlogq_avx512vl(auVar12,auVar16,auVar3,0xec);
    if ((auVar12 & ~auVar19) == (undefined1  [16])0x0) {
      auVar12 = vpand_avx(auVar17,auVar13);
      auVar12 = vpternlogq_avx512vl(auVar12,auVar14,auVar15,0xf8);
      auVar12 = vpternlogq_avx512vl(auVar12,auVar18,auVar3,0xf8);
      if ((auVar19 & ~auVar12) != (undefined1  [16])0x0) {
        auVar12 = vpandn_avx(auVar12,auVar19);
      }
    }
    else {
      auVar12 = vpandn_avx(auVar19,auVar12);
    }
    auVar14 = vpcmpeqd_avx(auVar14,auVar14);
    auVar14 = vpsignw_avx(auVar12,auVar14);
    auVar14 = vpand_avx(auVar12,auVar14);
    (anonymous_namespace)::solver_last._496_8_ = (anonymous_namespace)::solver_last._496_8_ + 1;
    if (auVar11._0_4_ < 0x30000) {
      auVar11 = *(undefined1 (*) [16])(this->solution_).bands[0][(int)band_idx].configurations.vec;
      bVar6 = false;
      lVar9 = 0;
      pSVar8 = &local_240;
      do {
        lVar10 = 0x10;
        do {
          puVar1 = (undefined8 *)
                   ((long)(this->solution_).bands[lVar9 + -1][2].eliminations.vec + lVar10);
          uVar4 = puVar1[1];
          puVar2 = (undefined8 *)((long)(pSVar8->bands + -1) + 0x50 + lVar10);
          *puVar2 = *puVar1;
          puVar2[1] = uVar4;
          puVar1 = (undefined8 *)
                   ((long)(this->solution_).bands[lVar9][0].configurations.vec + lVar10);
          uVar4 = puVar1[1];
          puVar2 = (undefined8 *)((long)pSVar8->bands[0][0].configurations.vec + lVar10);
          *puVar2 = *puVar1;
          puVar2[1] = uVar4;
          lVar10 = lVar10 + 0x20;
        } while (lVar10 != 0x70);
        lVar9 = 1;
        bVar5 = !bVar6;
        bVar6 = true;
        pSVar8 = (State *)(local_240.bands + 1);
      } while (bVar5);
      memcpy(local_240.boxen,(this->solution_).boxen,0x120);
      pSVar8 = (State *)(ulong)band_idx;
      auVar11 = vpand_avx(auVar11,auVar14);
      uVar7 = vpcmpgtq_avx512vl(auVar11,(undefined1  [16])0x0);
      auVar14 = vpcmpgtq_avx(auVar11,(undefined1  [16])0x0);
      auVar14 = vpslldq_avx(auVar14,1);
      auVar3._8_8_ = 1;
      auVar3._0_8_ = 1;
      auVar14 = vandnpd_avx512vl(auVar14,auVar3);
      auVar14 = vpsubq_avx512vl(auVar11,auVar14);
      bVar6 = (bool)((byte)(uVar7 & 3) & 1);
      auVar17._0_8_ = (ulong)bVar6 * auVar14._0_8_ | (ulong)!bVar6 * auVar11._0_8_;
      uVar7 = (uVar7 & 3) >> 1;
      auVar17._8_8_ = uVar7 * auVar14._8_8_ | (ulong)!SUB81(uVar7,0) * auVar11._8_8_;
      auVar14 = vpand_avx(auVar17,auVar11);
      auVar12 = vpor_avx(auVar14,*(undefined1 (*) [16])
                                  local_240.bands[0][(int)band_idx].eliminations.vec);
      *(undefined1 (*) [16])local_240.bands[0][(int)band_idx].eliminations.vec = auVar12;
      bVar6 = BandEliminate<0>(&local_240,band_idx,0);
      if ((bVar6) &&
         (CountSolutionsConsistentWithPartialAssignment((SolverDpllTriadSimd<1> *)&local_240,pSVar8)
         , (anonymous_namespace)::solver_last._488_8_ == (anonymous_namespace)::solver_last._480_8_)
         ) {
        return;
      }
      pSVar8 = (State *)(ulong)band_idx;
      auVar11 = vpternlogq_avx512vl(auVar11,auVar14,
                                    *(undefined1 (*) [16])
                                     (this->solution_).bands[0][(int)band_idx].eliminations.vec,0xbe
                                   );
      *(undefined1 (*) [16])(this->solution_).bands[0][(int)band_idx].eliminations.vec = auVar11;
      bVar6 = BandEliminate<0>(&this->solution_,band_idx,0);
    }
    else {
      bVar6 = false;
      lVar9 = 0;
      auVar11 = *(undefined1 (*) [16])(this->solution_).boxen[(long)(int)band_idx + -3].cells.vec;
      pSVar8 = &local_240;
      do {
        lVar10 = 0x10;
        do {
          puVar1 = (undefined8 *)
                   ((long)(this->solution_).bands[lVar9 + -1][2].eliminations.vec + lVar10);
          uVar4 = puVar1[1];
          puVar2 = (undefined8 *)((long)(pSVar8->bands + -1) + 0x50 + lVar10);
          *puVar2 = *puVar1;
          puVar2[1] = uVar4;
          puVar1 = (undefined8 *)
                   ((long)(this->solution_).bands[lVar9][0].configurations.vec + lVar10);
          uVar4 = puVar1[1];
          puVar2 = (undefined8 *)((long)pSVar8->bands[0][0].configurations.vec + lVar10);
          *puVar2 = *puVar1;
          puVar2[1] = uVar4;
          lVar10 = lVar10 + 0x20;
        } while (lVar10 != 0x70);
        lVar9 = 1;
        bVar5 = !bVar6;
        bVar6 = true;
        pSVar8 = (State *)(local_240.bands + 1);
      } while (bVar5);
      memcpy(local_240.boxen,(this->solution_).boxen,0x120);
      auVar11 = vpand_avx(auVar11,auVar14);
      uVar7 = vpcmpgtq_avx512vl(auVar11,(undefined1  [16])0x0);
      auVar14 = vpcmpgtq_avx(auVar11,(undefined1  [16])0x0);
      auVar14 = vpslldq_avx(auVar14,1);
      auVar12._8_8_ = 1;
      auVar12._0_8_ = 1;
      auVar14 = vandnpd_avx512vl(auVar14,auVar12);
      auVar14 = vpsubq_avx512vl(auVar11,auVar14);
      bVar6 = (bool)((byte)(uVar7 & 3) & 1);
      auVar13._0_8_ = (ulong)bVar6 * auVar14._0_8_ | (ulong)!bVar6 * auVar11._0_8_;
      uVar7 = (uVar7 & 3) >> 1;
      auVar13._8_8_ = uVar7 * auVar14._8_8_ | (ulong)!SUB81(uVar7,0) * auVar11._8_8_;
      auVar14 = vpand_avx(auVar13,auVar11);
      auVar12 = vpor_avx(auVar14,*(undefined1 (*) [16])
                                  (local_240.boxen[(long)(int)band_idx + -3].cells.vec + 2));
      *(undefined1 (*) [16])(local_240.boxen[(long)(int)band_idx + -3].cells.vec + 2) = auVar12;
      pSVar8 = (State *)(ulong)band_idx;
      bVar6 = BandEliminate<1>(&local_240,band_idx,0);
      if ((bVar6) &&
         (CountSolutionsConsistentWithPartialAssignment((SolverDpllTriadSimd<1> *)&local_240,pSVar8)
         , (anonymous_namespace)::solver_last._488_8_ == (anonymous_namespace)::solver_last._480_8_)
         ) {
        return;
      }
      pSVar8 = (State *)(ulong)band_idx;
      auVar11 = vpternlogq_avx512vl(auVar11,auVar14,
                                    *(undefined1 (*) [16])
                                     ((this->solution_).boxen[(long)(int)band_idx + -3].cells.vec +
                                     2),0xbe);
      *(undefined1 (*) [16])((this->solution_).boxen[(long)(int)band_idx + -3].cells.vec + 2) =
           auVar11;
      bVar6 = BandEliminate<1>(&this->solution_,band_idx,0);
    }
    if (bVar6 != false) {
      CountSolutionsConsistentWithPartialAssignment(this,pSVar8);
    }
  }
  else {
    (anonymous_namespace)::solver_last._488_8_ = (anonymous_namespace)::solver_last._488_8_ + 1;
    if ((anonymous_namespace)::solver_last._488_8_ == (anonymous_namespace)::solver_last._480_8_) {
      memcpy((anonymous_namespace)::solver_last,this,0x1e0);
    }
  }
  return;
}

Assistant:

void CountSolutionsConsistentWithPartialAssignment(State &state) {
        auto band_and_value = ChooseBandAndValueToBranch(state);
        if (band_and_value.first == NONE) {
            num_solutions_++;
            if (solution_mode == 1 && num_solutions_ == limit_) solution_ = state;
            if (solution_mode == 2) ReportSolution(state);
        } else {
            if (band_and_value.first < 3) {
                BranchOnBandAndValue<0>(
                        tables.mod3[band_and_value.first], band_and_value.second, state);
            } else {
                BranchOnBandAndValue<1>(
                        tables.mod3[band_and_value.first], band_and_value.second, state);
            }
        }
    }